

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

unsigned_long stb_rand(void)

{
  long lVar1;
  ulong uVar2;
  
  if ((ulong)(uint)stb__mt_index < 0x1380) {
    uVar2 = *(ulong *)((long)stb__mt_buffer + (ulong)(uint)stb__mt_index);
    stb__mt_index = stb__mt_index + 8;
  }
  else {
    if (stb__mt_index != 0x1380) {
      stb_srand(0);
    }
    for (lVar1 = 0; lVar1 != 0xe3; lVar1 = lVar1 + 1) {
      uVar2 = 0x9908b0df;
      if ((stb__mt_buffer[lVar1 + 1] & 1) == 0) {
        uVar2 = 0;
      }
      stb__mt_buffer[lVar1] =
           uVar2 ^ stb__mt_buffer[lVar1 + 0x18d] ^
           (ulong)(((uint)stb__mt_buffer[lVar1 + 1] & 0x7ffffffe |
                   (uint)stb__mt_buffer[lVar1] & 0x80000000) >> 1);
    }
    for (lVar1 = 0; lVar1 != 0x18c; lVar1 = lVar1 + 1) {
      uVar2 = 0x9908b0df;
      if ((stb__mt_buffer[lVar1 + 0xe4] & 1) == 0) {
        uVar2 = 0;
      }
      stb__mt_buffer[lVar1 + 0xe3] =
           uVar2 ^ stb__mt_buffer[lVar1] ^
           (ulong)(((uint)stb__mt_buffer[lVar1 + 0xe4] & 0x7ffffffe |
                   (uint)stb__mt_buffer[lVar1 + 0xe3] & 0x80000000) >> 1);
    }
    uVar2 = 0;
    if ((stb__mt_buffer[0] & 1) != 0) {
      uVar2 = 0x9908b0df;
    }
    stb__mt_buffer[0x26f] =
         uVar2 ^ stb__mt_buffer[0x18c] ^
         (ulong)(((uint)stb__mt_buffer[0] & 0x7ffffffe | (uint)stb__mt_buffer[0x26f] & 0x80000000)
                >> 1);
    stb__mt_index = 8;
    uVar2 = stb__mt_buffer[0];
  }
  uVar2 = uVar2 >> 0xb ^ uVar2;
  uVar2 = ((uint)uVar2 & 0x13a58ad) << 7 ^ uVar2;
  uVar2 = ((uint)uVar2 & 0x1df8c) << 0xf ^ uVar2;
  return uVar2 >> 0x12 ^ uVar2;
}

Assistant:

unsigned long stb_rand()
{
   unsigned long * b = stb__mt_buffer;
   int idx = stb__mt_index;
   unsigned long s,r;
   int i;
	
   if (idx >= STB__MT_LEN*sizeof(unsigned long)) {
      if (idx > STB__MT_LEN*sizeof(unsigned long))
         stb_srand(0);
      idx = 0;
      i = 0;
      for (; i < STB__MT_IB; i++) {
         s = STB__TWIST(b, i, i+1);
         b[i] = b[i + STB__MT_IA] ^ (s >> 1) ^ STB__MAGIC(s);
      }
      for (; i < STB__MT_LEN-1; i++) {
         s = STB__TWIST(b, i, i+1);
         b[i] = b[i - STB__MT_IB] ^ (s >> 1) ^ STB__MAGIC(s);
      }
      
      s = STB__TWIST(b, STB__MT_LEN-1, 0);
      b[STB__MT_LEN-1] = b[STB__MT_IA-1] ^ (s >> 1) ^ STB__MAGIC(s);
   }
   stb__mt_index = idx + sizeof(unsigned long);
   
   r = *(unsigned long *)((unsigned char *)b + idx);
   
   r ^= (r >> 11);
   r ^= (r << 7) & 0x9D2C5680;
   r ^= (r << 15) & 0xEFC60000;
   r ^= (r >> 18);
   
   return r;
}